

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O3

snmp_request_id_t SNMPPacket::generate_request_id(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  do {
    iVar1 = rand();
    iVar2 = rand();
    uVar3 = (long)iVar2 | (long)iVar1 << 8;
  } while (uVar3 == 0);
  return uVar3;
}

Assistant:

snmp_request_id_t SNMPPacket::generate_request_id(){
    //NOTE: do not generate 0
    snmp_request_id_t request_id = 0;
    while(request_id == 0){
        request_id |= rand();
        request_id <<= 8;
        request_id |= rand();
    }
    return request_id;
}